

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::EvalContext::createLocal(EvalContext *this,ValueSymbol *symbol,ConstantValue *value)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  reference this_00;
  Type *pTVar4;
  SVInt *this_01;
  ConstantValue local_50;
  mapped_type *local_28;
  ConstantValue *result;
  ConstantValue *value_local;
  ValueSymbol *symbol_local;
  EvalContext *this_local;
  
  result = value;
  value_local = (ConstantValue *)symbol;
  symbol_local = (ValueSymbol *)this;
  bVar1 = SmallVectorBase<slang::ast::EvalContext::Frame>::empty
                    (&(this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>);
  if (bVar1) {
    assert::assertFailed
              ("!stack.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/EvalContext.cpp"
               ,0x16,
               "ConstantValue *slang::ast::EvalContext::createLocal(const ValueSymbol *, ConstantValue)"
              );
  }
  this_00 = SmallVectorBase<slang::ast::EvalContext::Frame>::back
                      (&(this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>);
  local_28 = std::
             map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
             ::operator[](&this_00->temporaries,(key_type *)&value_local);
  bVar1 = slang::ConstantValue::operator_cast_to_bool(value);
  if (bVar1) {
    bVar1 = slang::ConstantValue::isInteger(value);
    if (bVar1) {
      this_01 = slang::ConstantValue::integer(value);
      bVar2 = SVInt::getBitWidth(this_01);
      pTVar4 = ValueSymbol::getType((ValueSymbol *)value_local);
      bVar3 = Type::getBitWidth(pTVar4);
      if (bVar2 != bVar3) {
        assert::assertFailed
                  ("!value.isInteger() || value.integer().getBitWidth() == symbol->getType().getBitWidth()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/EvalContext.cpp"
                   ,0x1d,
                   "ConstantValue *slang::ast::EvalContext::createLocal(const ValueSymbol *, ConstantValue)"
                  );
      }
    }
    slang::ConstantValue::operator=(local_28,value);
  }
  else {
    pTVar4 = ValueSymbol::getType((ValueSymbol *)value_local);
    Type::getDefaultValue(&local_50,pTVar4);
    slang::ConstantValue::operator=(local_28,&local_50);
    slang::ConstantValue::~ConstantValue(&local_50);
  }
  return local_28;
}

Assistant:

ConstantValue* EvalContext::createLocal(const ValueSymbol* symbol, ConstantValue value) {
    ASSERT(!stack.empty());
    ConstantValue& result = stack.back().temporaries[symbol];
    if (!value) {
        result = symbol->getType().getDefaultValue();
    }
    else {
        ASSERT(!value.isInteger() ||
               value.integer().getBitWidth() == symbol->getType().getBitWidth());

        result = std::move(value);
    }

    return &result;
}